

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::upsample(Mesh *this)

{
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar1;
  Scene *pSVar2;
  XFormWidget *pXVar3;
  long lVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  plVar1 = &(this->mesh).faces;
  p_Var5 = (_List_node_base *)plVar1;
  do {
    p_Var5 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var5->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar1) goto LAB_00170590;
    lVar4 = 3;
    p_Var6 = p_Var5[0xb]._M_prev;
    do {
      p_Var6 = p_Var6[2]._M_next;
      lVar4 = lVar4 + -1;
    } while (p_Var5[0xb]._M_prev != p_Var6);
  } while (lVar4 == 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Warning: refusing to apply Loop subdivision to surface with non-triangular faces!",
             0x51);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"(Try triangulating first.)",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  if (p_Var5 == (_List_node_base *)plVar1) {
LAB_00170590:
    MeshResampler::upsample((MeshResampler *)&this->field_0x1f0,&this->mesh);
    for (p_Var5 = (this->mesh).vertices.
                  super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                  super__List_node_base._M_next; p_Var5 != (_List_node_base *)&(this->mesh).vertices
        ; p_Var5 = p_Var5->_M_next) {
      p_Var5[4]._M_next = p_Var5[2]._M_prev;
      p_Var5[3]._M_next = p_Var5[1]._M_prev;
      p_Var5[3]._M_prev = p_Var5[2]._M_next;
    }
    pSVar2 = (this->super_SceneObject).scene;
    (pSVar2->selected).coordinates.z = 0.0;
    (pSVar2->selected).coordinates.x = 0.0;
    (pSVar2->selected).coordinates.y = 0.0;
    (pSVar2->selected).object = (SceneObject *)0x0;
    (pSVar2->selected).element = (HalfedgeElement *)0x0;
    (pSVar2->selected).axis = None;
    pSVar2 = (this->super_SceneObject).scene;
    (pSVar2->hovered).coordinates.z = 0.0;
    (pSVar2->hovered).coordinates.x = 0.0;
    (pSVar2->hovered).coordinates.y = 0.0;
    (pSVar2->hovered).object = (SceneObject *)0x0;
    (pSVar2->hovered).element = (HalfedgeElement *)0x0;
    (pSVar2->hovered).axis = None;
    pXVar3 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar3->target).coordinates.z = 0.0;
    (pXVar3->target).coordinates.x = 0.0;
    (pXVar3->target).coordinates.y = 0.0;
    (pXVar3->target).object = (SceneObject *)0x0;
    (pXVar3->target).element = (HalfedgeElement *)0x0;
    (pXVar3->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::upsample() {
  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if (f->degree() != 3) {
      cerr << "Warning: refusing to apply Loop subdivision to surface with "
              "non-triangular faces!"
           << endl;
      cerr << "(Try triangulating first.)" << endl;
      return;
    }
  }
  resampler.upsample(mesh);
  // Make sure the bind position is set
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->bindPosition = v->position;
  }
  scene->selected.clear();
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}